

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_pushcclosure(lua_State *L,lua_CFunction fn,int n)

{
  ushort uVar1;
  int iVar2;
  StkId pTVar3;
  long lVar4;
  int *piVar5;
  CClosure *pCVar6;
  long lVar7;
  char *__assertion;
  long lVar8;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x244,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
  }
  if (n != 0) {
    lVar8 = (long)n;
    if ((long)L->top - (long)L->ci->func >> 4 <= lVar8) {
      __assert_fail("((n) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x24b,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
    }
    if (0x7d < n) {
      luaG_runerror(L,"upvalue index too large");
    }
    pCVar6 = luaF_newCclosure(L,n);
    pCVar6->f = fn;
    L->top = L->top + -lVar8;
    lVar7 = lVar8 * 0x10 + 0x10;
    do {
      pTVar3 = L->top;
      lVar4 = *(long *)((long)&pTVar3[-2].value_ + lVar7);
      *(long *)((long)&((CClosure *)(pCVar6->upvalue + -2))->next + lVar7) = lVar4;
      uVar1 = *(ushort *)((long)pTVar3 + lVar7 + -0x18);
      *(ushort *)((long)pCVar6->upvalue + lVar7 + -0x18) = uVar1;
      if (((short)uVar1 < 0) &&
         (((uVar1 & 0x7f) != (ushort)*(byte *)(lVar4 + 8) ||
          ((*(byte *)(lVar4 + 9) & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x253,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
      }
      lVar8 = lVar8 + -1;
      lVar7 = lVar7 + -0x10;
    } while (lVar8 != 0);
    if ((pCVar6->tt & 0xe) < 10) {
      pTVar3 = L->top;
      (pTVar3->value_).gc = (GCObject *)pCVar6;
      pTVar3->tt_ = 0x8026;
      if ((pCVar6->tt == '&') && ((pCVar6->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
        pTVar3 = L->top;
        L->top = pTVar3 + 1;
        if (L->ci->top < pTVar3 + 1) {
          __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,599,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
        }
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        goto LAB_00121e7a;
      }
      __assertion = "0";
    }
    else {
      __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x256,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
  }
  pTVar3 = L->top;
  (pTVar3->value_).f = fn;
  pTVar3->tt_ = 0x16;
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  if (L->ci->top < pTVar3 + 1) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x247,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
  }
LAB_00121e7a:
  piVar5 = *(int **)&L[-1].hookmask;
  *piVar5 = *piVar5 + -1;
  if (*piVar5 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x25a,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
}

Assistant:

LUA_API void lua_pushcclosure (lua_State *L, lua_CFunction fn, int n) {
  lua_lock(L);
  if (n == 0) {
    setfvalue(L->top, fn);
    api_incr_top(L);
  }
  else {
    CClosure *cl;
    api_checknelems(L, n);
    if (n > MAXUPVAL)
      luaG_runerror(L, "upvalue index too large");
    api_check(L, n <= MAXUPVAL, "upvalue index too large");
    cl = luaF_newCclosure(L, n);
    cl->f = fn;
    L->top -= n;
    while (n--) {
      setobj2n(L, &cl->upvalue[n], L->top + n);
      /* does not need barrier because closure is white */
    }
    setclCvalue(L, L->top, cl);
    api_incr_top(L);
    luaC_checkGC(L);
  }
  lua_unlock(L);
}